

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.hpp
# Opt level: O0

enable_if_type<_std::is_void<result_type<_Mem_fn<bool_(Configuration::*)(const_basic_string<char>_&)>_&&(Configuration_*&&,_basic_string<char>_&)>_>::value,_std::pair<Mark,_result_type<_Mem_fn<bool_(Configuration::*)(const_basic_string<char>_&)>_&&(Configuration_*&&,_basic_string<char>_&)>_>_>
* __thiscall
bm::GenericBench<std::chrono::_V2::steady_clock>::
mark<std::_Mem_fn<bool(Configuration::*)(std::__cxx11::string_const&)>,Configuration*,std::__cxx11::string&>
          (enable_if_type<_std::is_void<result_type<_Mem_fn<bool_(Configuration::*)(const_basic_string<char>_&)>_&&(Configuration_*&&,_basic_string<char>_&)>_>::value,_std::pair<Mark,_result_type<_Mem_fn<bool_(Configuration::*)(const_basic_string<char>_&)>_&&(Configuration_*&&,_basic_string<char>_&)>_>_>
           *__return_storage_ptr__,GenericBench<std::chrono::_V2::steady_clock> *this,
          _Mem_fn<bool_(Configuration::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *func,Configuration **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  duration<long,_std::ratio<1L,_1000000000L>_> local_88;
  undefined1 local_80 [8];
  Mark mark;
  time_point after;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_30;
  type result;
  time_point before;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  Configuration **args_local;
  _Mem_fn<bool_(Configuration::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *func_local;
  
  before.__d.__r = (duration)(duration)args;
  tStack_30.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  after.__d.__r._7_1_ =
       std::_Mem_fn_base<bool(Configuration::*)(std::__cxx11::string_const&),true>::operator()
                 (this,(Configuration **)func,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  before.__d.__r);
  mark._overflow_callback._M_invoker = (_Invoker_type)std::chrono::_V2::steady_clock::now();
  local_88.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&mark._overflow_callback._M_invoker,&stack0xffffffffffffffd0);
  Mark::Mark<long,std::ratio<1l,1000000000l>>((Mark *)local_80,&local_88);
  std::make_pair<bm::Mark&,bool&>
            (__return_storage_ptr__,(Mark *)local_80,(bool *)((long)&after.__d.__r + 7));
  Mark::~Mark((Mark *)local_80);
  return __return_storage_ptr__;
}

Assistant:

static auto mark(Func&& func, Args&&... args)
        -> enable_if_type< !std::is_void<result_type<Func&&(Args&&...)>>::value,
                           std::pair<Mark, result_type<Func&&(Args&&...)>> >
    {
        auto before = Clock::now();
        auto result = std::forward<Func>(func)(std::forward<Args>(args)...);
        auto after = Clock::now();
        auto mark = Mark(after - before);
        return std::make_pair(mark, result);
    }